

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall mjs::lexer::next_token(lexer *this)

{
  uint *puVar1;
  anon_unknown_2 *this_00;
  wstring_view *text;
  size_t sVar2;
  bool bVar3;
  unsigned_long uVar4;
  classification cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  void *pvVar10;
  int *piVar11;
  runtime_error *prVar12;
  ostream *poVar13;
  long lVar14;
  bool bVar15;
  uint uVar16;
  anon_unknown_2 *paVar17;
  version vVar18;
  byte bVar19;
  version in_R9D;
  anon_unknown_2 *pos;
  long lVar20;
  long lVar21;
  anon_unknown_2 *paVar22;
  bool bVar23;
  double dVar24;
  wstring_view s_00;
  wstring_view text_00;
  wstring_view text_01;
  wstring_view text_02;
  wstring_view text_03;
  wstring s;
  char *end;
  ostringstream oss;
  wstring local_208;
  token local_1e8;
  uint *local_1c0;
  wchar_t **local_1b8;
  char *local_1b0;
  pair<mjs::token,_unsigned_long> local_1a8 [7];
  
  this_00 = (anon_unknown_2 *)(this->text_)._M_len;
  paVar22 = (anon_unknown_2 *)this->text_pos_;
  paVar17 = this_00 + -(long)paVar22;
  if (paVar17 == (anon_unknown_2 *)0x0) {
    token::operator=(&this->current_token_,(token *)eof_token);
    return;
  }
  if (this_00 < paVar22 || paVar17 == (anon_unknown_2 *)0x0) {
    __assert_fail("text_pos_ < text_.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x22a,"void mjs::lexer::next_token()");
  }
  text = (wstring_view *)(this->text_)._M_str;
  puVar1 = (uint *)((long)&text->_M_len + (long)paVar22 * 4);
  uVar8 = *puVar1;
  pos = paVar22 + 1;
  if ((uVar8 == 0x27) || (uVar8 == 0x22)) {
    vVar18 = this->version_;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = L'\0';
    uVar8 = *puVar1;
    if ((uVar8 != 0x22) && (uVar8 != 0x27)) {
      __assert_fail("ch == \'\"\' || ch == \'\\\'\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                    ,0xd9,
                    "std::pair<token, size_t> mjs::(anonymous namespace)::get_string_literal(const std::wstring_view, const size_t, version)"
                   );
    }
    if (pos < this_00) {
      local_1b8 = &text->_M_str;
      bVar23 = false;
      local_1c0 = (uint *)CONCAT44(local_1c0._4_4_,vVar18);
      do {
        paVar17 = pos;
        uVar16 = *(uint *)((long)&text->_M_len + (long)paVar17 * 4);
        if (!bVar23) {
          bVar23 = true;
          if (uVar16 == 0x5c) goto LAB_00181f44;
          if (uVar16 != uVar8) {
            if (((uVar16 == 10) || (uVar16 == 0xd)) ||
               ((vVar18 != es1 && ((uVar16 & 0xfffffffe) == 0x2028)))) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar12,"Line terminator in string");
              goto LAB_001826c6;
            }
            if ((vVar18 == es3) && (cVar5 = anon_unknown_2::classify(uVar16), cVar5 == format)) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10,uVar16);
              std::runtime_error::runtime_error
                        (prVar12,"Format control characters not allowed in string literals in ES3");
              goto LAB_001826c6;
            }
            goto LAB_00181f38;
          }
          token::token(&local_1e8,string_literal,&local_208);
          local_1a8[0].first.type_ = eof;
          token::operator=(&local_1a8[0].first,&local_1e8);
          local_1a8[0].second = (unsigned_long)(paVar22 + 2);
          token::destroy(&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT44(local_208.field_2._M_local_buf[1],
                                     local_208.field_2._M_local_buf[0]) * 4 + 4);
          }
          token::operator=(&this->current_token_,&local_1a8[0].first);
          uVar4 = local_1a8[0].second;
          token::destroy(&local_1a8[0].first);
          local_1a8[0].second = uVar4;
          goto LAB_0018218f;
        }
        if ((int)uVar16 < 0x58) {
          if (0x37 < uVar16) {
LAB_00181f92:
            if (uVar16 != 0x55) goto switchD_00181ef4_caseD_6f;
switchD_00181ef4_caseD_75:
            if (this_00 <= paVar22 + 6) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar12,"Invalid unicode escape sequence");
              goto LAB_001826c6;
            }
            get_hex_value4((wchar_t *)((long)local_1b8 + (long)paVar22 * 4));
            std::__cxx11::wstring::push_back((wchar_t)&local_208);
            paVar17 = paVar22 + 5;
LAB_00181fc2:
            bVar23 = false;
            goto LAB_00181f44;
          }
          uVar9 = (ulong)uVar16;
          if ((0xff000000000000U >> (uVar9 & 0x3f) & 1) != 0) {
            lVar14 = (ulong)(uVar16 - 0x30 < 4) + 2;
            lVar20 = 1;
            while (lVar21 = lVar20, paVar17 + lVar20 < this_00) {
              uVar16 = *(int *)((long)&text->_M_len + lVar20 * 4 + (long)paVar17 * 4) - 0x30;
              if (9 < uVar16) {
                uVar16 = 0xffffffff;
              }
              if ((7 < uVar16) || (lVar20 = lVar20 + 1, lVar21 = lVar14, lVar14 == lVar20)) break;
            }
            std::__cxx11::wstring::push_back((wchar_t)&local_208);
            paVar17 = paVar22 + lVar21;
            bVar23 = false;
            vVar18 = (version)local_1c0;
            goto LAB_00181f44;
          }
          if ((0x2400UL >> (uVar9 & 0x3f) & 1) == 0) {
            if ((0x8400000000U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00181f38;
            goto LAB_00181f92;
          }
          goto LAB_00181feb;
        }
        if ((int)uVar16 < 0x66) {
          if (uVar16 == 0x58) goto switchD_00181ef4_caseD_78;
          if ((uVar16 == 0x5c) || (uVar16 == 0x62)) goto LAB_00181f38;
          goto switchD_00181ef4_caseD_6f;
        }
        switch(uVar16) {
        case 0x6e:
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x77:
          goto switchD_00181ef4_caseD_6f;
        case 0x72:
          break;
        case 0x74:
          break;
        case 0x75:
          goto switchD_00181ef4_caseD_75;
        case 0x76:
          if (vVar18 == es1) goto LAB_0018201a;
          break;
        case 0x78:
switchD_00181ef4_caseD_78:
          if (this_00 <= paVar22 + 4) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar12,"Invalid hex escape sequence");
            goto LAB_001826c6;
          }
          get_hex_value(*(int *)((long)&text->_M_str + (long)paVar22 * 4));
          get_hex_value(*(int *)((long)&text->_M_str + (long)paVar22 * 4 + 4));
          std::__cxx11::wstring::push_back((wchar_t)&local_208);
          paVar17 = paVar22 + 3;
          goto LAB_00181fc2;
        default:
          if (uVar16 == 0x66) break;
          goto switchD_00181ef4_caseD_6f;
        }
LAB_00181f38:
        std::__cxx11::wstring::push_back((wchar_t)&local_208);
LAB_00181f42:
        bVar23 = false;
LAB_00181f44:
        pos = paVar17 + 1;
        paVar22 = paVar17;
      } while (paVar17 + 1 < this_00);
    }
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"Unterminated string");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  vVar18 = this->version_;
  if (((uVar8 == 10) || (uVar8 == 0xd)) || ((uVar8 & 0xfffffffe) == 0x2028 && vVar18 != es1)) {
    paVar22 = pos;
    if (pos < this_00) {
      do {
        uVar8 = *(uint *)((long)&text->_M_len + (long)pos * 4);
        if (((uVar8 != 10) && (uVar8 != 0xd)) &&
           ((paVar22 = pos, vVar18 == es1 || ((uVar8 & 0xfffffffe) != 0x2028)))) break;
        pos = pos + 1;
        paVar22 = this_00;
      } while (this_00 != pos);
    }
    local_1a8[0].first.type_ = line_terminator;
    token::operator=(&this->current_token_,&local_1a8[0].first);
    token::destroy(&local_1a8[0].first);
    local_1a8[0].second = (unsigned_long)paVar22;
    goto LAB_0018218f;
  }
  if (uVar8 - 0x30 < 10) {
    if (uVar8 != 0x30) goto LAB_00182271;
    dVar24 = 0.0;
    paVar17 = pos;
    if (pos < this_00) {
      iVar6 = *(int *)((long)&text->_M_len + (long)paVar22 * 4 + 4);
      if (iVar6 == 0x2e) goto LAB_00182271;
      iVar6 = tolower(iVar6);
      if (iVar6 == 0x78) {
        paVar22 = paVar22 + 2;
        dVar24 = 0.0;
        paVar17 = paVar22;
        if (paVar22 < this_00) {
          do {
            iVar6 = *(int *)((long)&text->_M_len + (long)paVar22 * 4);
            if ((9 < iVar6 - 0x30U) && (iVar7 = isalpha(iVar6), paVar17 = paVar22, iVar7 == 0))
            break;
            uVar8 = get_hex_value(iVar6);
            dVar24 = dVar24 * 16.0 + (double)uVar8;
            paVar22 = paVar22 + 1;
            paVar17 = this_00;
          } while (this_00 != paVar22);
        }
      }
      else {
        dVar24 = 0.0;
        do {
          uVar8 = *(uint *)((long)&text->_M_len + (long)pos * 4);
          paVar17 = pos;
          if (9 < uVar8 - 0x30) break;
          if (0x37 < uVar8) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_208,'\x01');
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1e8,"Invalid octal digit: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208);
            std::runtime_error::runtime_error(prVar12,(string *)&local_1e8);
            __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          dVar24 = dVar24 * 8.0 + (double)(int)uVar8 + -48.0;
          pos = pos + 1;
          paVar17 = this_00;
        } while (this_00 != pos);
      }
    }
    local_1e8.type_ = numeric_literal;
    local_1a8[0].first.type_ = eof;
    local_1e8.field_1.ivalue_ = (uint64_t)dVar24;
    token::operator=(&local_1a8[0].first,&local_1e8);
    local_1a8[0].second = (unsigned_long)paVar17;
    token::destroy(&local_1e8);
  }
  else {
    if ((this_00 <= pos || uVar8 != 0x2e) ||
       (9 < *(int *)((long)&text->_M_len + (long)paVar22 * 4 + 4) - 0x30U)) {
      local_1c0 = puVar1;
      pvVar10 = memchr("!%&()*+,-./:;<=>?[]^{|}~",uVar8,0x19);
      if (pvVar10 == (void *)0x0) {
        if (((uVar8 < 0x21) && ((0x100001a00U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
           (uVar8 == 0xfeff && 1 < (int)vVar18)) {
          text_00._M_str = (wchar_t *)paVar22;
          text_00._M_len = (size_t)text;
          anon_unknown_2::skip_whitespace(local_1a8,this_00,text_00,(ulong)vVar18,in_R9D);
          token::operator=(&this->current_token_,&local_1a8[0].first);
          token::destroy(&local_1a8[0].first);
        }
        else if ((((uVar8 == 0x24) || (uVar8 == 0x5f)) || ((uVar8 & 0xffffffdf) - 0x41 < 0x1a)) ||
                (uVar8 == 0x5c && 0 < (int)vVar18)) {
          text_01._M_str = (wchar_t *)paVar22;
          text_01._M_len = (size_t)text;
          anon_unknown_2::get_identifier(local_1a8,this_00,text_01,(ulong)vVar18,in_R9D);
          token::operator=(&this->current_token_,&local_1a8[0].first);
          token::destroy(&local_1a8[0].first);
        }
        else {
          if ((int)vVar18 < 1) {
LAB_001828ac:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unhandled character in ",0x17);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"next_token",10)
            ;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
            poVar13 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," 0x",3);
            *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
                 *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,uVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar12,(string *)&local_1e8);
            __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          cVar5 = anon_unknown_2::classify(uVar8);
          if (cVar5 == id_start) {
            text_03._M_str = (wchar_t *)this->text_pos_;
            text_03._M_len = (size_t)(this->text_)._M_str;
            anon_unknown_2::get_identifier
                      (local_1a8,(anon_unknown_2 *)(this->text_)._M_len,text_03,
                       (ulong)this->version_,in_R9D);
            token::operator=(&this->current_token_,&local_1a8[0].first);
            token::destroy(&local_1a8[0].first);
          }
          else {
            if (cVar5 != whitespace) goto LAB_001828ac;
            text_02._M_str = (wchar_t *)this->text_pos_;
            text_02._M_len = (size_t)(this->text_)._M_str;
            anon_unknown_2::skip_whitespace
                      (local_1a8,(anon_unknown_2 *)(this->text_)._M_len,text_02,
                       (ulong)this->version_,in_R9D);
            token::operator=(&this->current_token_,&local_1a8[0].first);
            token::destroy(&local_1a8[0].first);
          }
        }
      }
      else if ((uVar8 == 0x2f && pos < this_00) &&
              ((iVar6 = *(int *)((long)&text->_M_len + (long)paVar22 * 4 + 4), iVar6 == 0x2f ||
               (iVar6 == 0x2a)))) {
        anon_unknown_2::skip_comment(local_1a8,this_00,text,(size_t)pos,vVar18);
        token::operator=(&this->current_token_,&local_1a8[0].first);
        token::destroy(&local_1a8[0].first);
      }
      else {
        s_00._M_str = (wchar_t *)paVar17;
        s_00._M_len = (size_t)&local_1e8;
        anon_unknown_2::get_punctuation(s_00,(version)local_1c0);
        sVar2 = this->text_pos_;
        local_1a8[0].first.type_ = local_1e8._4_4_;
        if ((local_1e8._4_4_ == string_literal) || (local_1e8._4_4_ == identifier)) {
          __assert_fail("!has_text()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h"
                        ,0xa9,"mjs::token::token(token_type)");
        }
        token::operator=(&this->current_token_,&local_1a8[0].first);
        token::destroy(&local_1a8[0].first);
        local_1a8[0].second = (unsigned_long)((long)(int)local_1e8.type_ + sVar2);
      }
      goto LAB_0018218f;
    }
LAB_00182271:
    paVar22 = pos;
    if (pos < this_00) {
      bVar23 = uVar8 == 0x2e;
      bVar3 = false;
      bVar19 = 0;
      bVar15 = false;
      do {
        uVar8 = *(uint *)((long)&text->_M_len + (long)pos * 4);
        if (uVar8 - 0x30 < 10) {
LAB_00182294:
          bVar19 = 0;
        }
        else if (uVar8 == 0x2e) {
          if (!bVar23) {
            bVar23 = true;
            goto LAB_00182294;
          }
LAB_001822d0:
          paVar22 = pos;
          if (bVar3 || (bool)(~bVar19 & 1)) break;
          bVar3 = true;
          bVar19 = 0;
          if ((uVar8 != 0x2d) && (uVar8 != 0x2b)) break;
        }
        else {
          if ((uVar8 & 0xffffffdf) != 0x45 || bVar15) goto LAB_001822d0;
          bVar15 = true;
          bVar19 = 1;
        }
        pos = pos + 1;
        paVar22 = this_00;
      } while (this_00 != pos);
    }
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<wchar_t_const*>
              ((string *)&local_208,puVar1,(long)&text->_M_len + (long)paVar22 * 4);
    piVar11 = __errno_location();
    *piVar11 = 0;
    local_1e8.field_1.dvalue_ = strtod((char *)local_208._M_dataplus._M_p,&local_1b0);
    if (local_1b0 != (char *)((long)local_208._M_dataplus._M_p + local_208._M_string_length)) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8
                     ,"Invalid string literal ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                    );
      std::runtime_error::runtime_error(prVar12,(string *)&local_1e8);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*piVar11 == 0x22) {
      *piVar11 = 0;
    }
    local_1e8.type_ = numeric_literal;
    local_1a8[0].first.type_ = eof;
    token::operator=(&local_1a8[0].first,&local_1e8);
    local_1a8[0].second = (unsigned_long)paVar22;
    token::destroy(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT44(local_208.field_2._M_local_buf[1],local_208.field_2._M_local_buf[0])
                      + 1);
    }
  }
  token::operator=(&this->current_token_,&local_1a8[0].first);
  uVar4 = local_1a8[0].second;
  token::destroy(&local_1a8[0].first);
  local_1a8[0].second = uVar4;
LAB_0018218f:
  this->text_pos_ = local_1a8[0].second;
  return;
switchD_00181ef4_caseD_6f:
  if ((vVar18 == es1) || ((uVar16 & 0xfffffffe) != 0x2028)) {
LAB_0018201a:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unhandled escape sequence: \\",0x1c);
    local_1e8.type_ = CONCAT31(local_1e8.type_._1_3_,(char)uVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1e8,1);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,(string *)&local_1e8);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00181feb:
  if ((int)vVar18 < 2) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar12,"Line continuations in string literals not supported until ES5");
LAB_001826c6:
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  goto LAB_00181f42;
}

Assistant:

std::pair<token, size_t> get_string_literal(const std::wstring_view text_, const size_t token_start, version ver) {
    bool escape = false;
    std::wstring s;
    const auto ch = text_[token_start];
    assert(ch == '"' || ch == '\'');
    size_t token_end = token_start + 1;
    for ( ;; ++token_end) {
        if (token_end >= text_.size()) {
            throw std::runtime_error("Unterminated string");
        }
        const auto qch = text_[token_end];
        if (escape) {
            escape = false;
            switch (qch) {
            case '\'': s.push_back('\''); break;
            case '\"': s.push_back('\"'); break;
            case '\\': s.push_back('\\'); break;
            case 'b': s.push_back('\b'); break;
            case 'f': s.push_back('\f'); break;
            case 'n': s.push_back('\n'); break;
            case 'r': s.push_back('\r'); break;
            case 't': s.push_back('\t'); break;
            case 'v':
                // '\v' only support in ES3 onwards
                if (ver == version::es1) {
                    goto invalid_escape_sequence;
                }
                s.push_back('\v');
                break;
                // HexEscapeSeqeunce
            case 'x': case 'X':
                ++token_end;
                if (token_end + 2 >= text_.size()) {
                    throw std::runtime_error("Invalid hex escape sequence");
                }
                s.push_back(static_cast<wchar_t>(get_hex_value2(&text_[token_end])));
                token_end += 1; // Incremented in loop
                break;
                // OctalEscapeSequence
            case '0': case '1': case '2': case '3':
            case '4': case '5': case '6': case '7':
                {
                    const auto [och, len] =  get_octal_escape_sequence(text_, token_end);
                    token_end += len-1; // Incremented in loop
                    s.push_back(static_cast<wchar_t>(och));
                    break;
                }
                break;
                // UnicodeEscapeSequence
            case 'u': case 'U':
                ++token_end;
                if (token_end + 4 >= text_.size()) {
                    throw std::runtime_error("Invalid unicode escape sequence");
                }
                s.push_back(static_cast<wchar_t>(get_hex_value4(&text_[token_end])));
                token_end += 3; // Incremented in loop
                break;
            default:
                if (is_line_terminator(qch, ver)) {
                    if (ver >= version::es5) {
                        // OK, line continuation
                        break;
                    }
                    throw std::runtime_error("Line continuations in string literals not supported until ES5");
                }
            invalid_escape_sequence:
                std::ostringstream oss;
                oss << "Unhandled escape sequence: \\" << (char)qch;
                throw std::runtime_error(oss.str());
            }
        } else if (qch == '\\') {
            escape = true;
        } else if (qch == ch) {
            ++token_end;
            break;
        } else if (is_line_terminator(qch, ver)) {
            throw std::runtime_error("Line terminator in string");
        } else {        
            if (ver == version::es3 && classify(qch) == unicode::classification::format) {
                throw std::runtime_error("Format control characters not allowed in string literals in ES3");
            }
            s.push_back(qch);
        }
    }

    return { token{token_type::string_literal, std::move(s)}, token_end };
}